

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningPlugin.cpp
# Opt level: O3

void crash_on_allocation_number(uint alloc_number)

{
  int iVar1;
  
  if (crash_on_allocation_number(unsigned_int)::crashAllocator == '\0') {
    iVar1 = __cxa_guard_acquire(&crash_on_allocation_number(unsigned_int)::crashAllocator);
    if (iVar1 != 0) {
      CrashOnAllocationAllocator::CrashOnAllocationAllocator
                (&crash_on_allocation_number::crashAllocator);
      __cxa_atexit(MemoryLeakAllocator::~MemoryLeakAllocator,
                   &crash_on_allocation_number::crashAllocator,&__dso_handle);
      __cxa_guard_release(&crash_on_allocation_number(unsigned_int)::crashAllocator);
    }
  }
  CrashOnAllocationAllocator::setNumberToCrashOn
            (&crash_on_allocation_number::crashAllocator,alloc_number);
  setCurrentMallocAllocator(&crash_on_allocation_number::crashAllocator.super_TestMemoryAllocator);
  setCurrentNewAllocator(&crash_on_allocation_number::crashAllocator.super_TestMemoryAllocator);
  setCurrentNewArrayAllocator(&crash_on_allocation_number::crashAllocator.super_TestMemoryAllocator)
  ;
  return;
}

Assistant:

void crash_on_allocation_number(unsigned alloc_number)
{
    static CrashOnAllocationAllocator crashAllocator;
    crashAllocator.setNumberToCrashOn(alloc_number);
    setCurrentMallocAllocator(&crashAllocator);
    setCurrentNewAllocator(&crashAllocator);
    setCurrentNewArrayAllocator(&crashAllocator);
}